

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

tdefl_status tinyexr::miniz::tdefl_flush_output_buffer(tdefl_compressor *d)

{
  long in_RDI;
  bool bVar1;
  size_t n;
  size_t local_18;
  
  if (*(long *)(in_RDI + 0x98) != 0) {
    **(long **)(in_RDI + 0x98) = *(long *)(in_RDI + 0xb0) - *(long *)(in_RDI + 0x88);
  }
  if (*(long *)(in_RDI + 0xa0) != 0) {
    if ((ulong)(**(long **)(in_RDI + 0xa0) - *(long *)(in_RDI + 0xc0)) <
        (ulong)*(uint *)(in_RDI + 0x74)) {
      local_18 = **(long **)(in_RDI + 0xa0) - *(long *)(in_RDI + 0xc0);
    }
    else {
      local_18 = (size_t)*(uint *)(in_RDI + 0x74);
    }
    memcpy((void *)(*(long *)(in_RDI + 0x90) + *(long *)(in_RDI + 0xc0)),
           (void *)(in_RDI + 0x392aa + (ulong)*(uint *)(in_RDI + 0x70)),local_18);
    *(int *)(in_RDI + 0x70) = (int)local_18 + *(int *)(in_RDI + 0x70);
    *(int *)(in_RDI + 0x74) = *(int *)(in_RDI + 0x74) - (int)local_18;
    *(size_t *)(in_RDI + 0xc0) = local_18 + *(long *)(in_RDI + 0xc0);
    **(undefined8 **)(in_RDI + 0xa0) = *(undefined8 *)(in_RDI + 0xc0);
  }
  bVar1 = false;
  if (*(int *)(in_RDI + 0x78) != 0) {
    bVar1 = *(int *)(in_RDI + 0x74) == 0;
  }
  return (uint)bVar1;
}

Assistant:

static tdefl_status tdefl_flush_output_buffer(tdefl_compressor *d) {
  if (d->m_pIn_buf_size) {
    *d->m_pIn_buf_size = d->m_pSrc - (const mz_uint8 *)d->m_pIn_buf;
  }

  if (d->m_pOut_buf_size) {
    size_t n = MZ_MIN(*d->m_pOut_buf_size - d->m_out_buf_ofs,
                      d->m_output_flush_remaining);
    memcpy((mz_uint8 *)d->m_pOut_buf + d->m_out_buf_ofs,
           d->m_output_buf + d->m_output_flush_ofs, n);
    d->m_output_flush_ofs += (mz_uint)n;
    d->m_output_flush_remaining -= (mz_uint)n;
    d->m_out_buf_ofs += n;

    *d->m_pOut_buf_size = d->m_out_buf_ofs;
  }

  return (d->m_finished && !d->m_output_flush_remaining) ? TDEFL_STATUS_DONE
                                                         : TDEFL_STATUS_OKAY;
}